

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

ValueEntry * rsg::anon_unknown_27::findByName(VariableManager *varManager,char *name)

{
  bool bVar1;
  deBool dVar2;
  ValueEntry **ppVVar3;
  Variable *this;
  char *a;
  FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  local_80;
  ValueEntry *local_68;
  ValueEntry *entry;
  undefined1 local_58 [8];
  Iterator end;
  undefined1 local_38 [8];
  Iterator iter;
  char *name_local;
  VariableManager *varManager_local;
  
  iter.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  ._16_8_ = name;
  VariableManager::getBegin<rsg::AnyEntry>(local_38,varManager);
  VariableManager::getEnd<rsg::AnyEntry>(local_58,varManager);
  while( true ) {
    bVar1 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
            ::operator!=((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
                          *)local_38,
                         (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
                          *)local_58);
    if (!bVar1) {
      return (ValueEntry *)0x0;
    }
    ppVVar3 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
              ::operator*((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
                           *)local_38);
    local_68 = *ppVVar3;
    this = ValueEntry::getVariable(local_68);
    a = Variable::getName(this);
    dVar2 = deStringEqual(a,(char *)iter.
                                    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
                                    ._16_8_);
    if (dVar2 != 0) break;
    FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
    ::operator++(&local_80,
                 (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
                  *)local_38,0);
  }
  return local_68;
}

Assistant:

const ValueEntry* findByName (VariableManager& varManager, const char* name)
{
	AnyEntry::Iterator	iter	= varManager.getBegin<AnyEntry>();
	AnyEntry::Iterator	end		= varManager.getEnd<AnyEntry>();
	for (; iter != end; iter++)
	{
		const ValueEntry* entry = *iter;
		if (deStringEqual(entry->getVariable()->getName(), name))
			return entry;
	}
	return DE_NULL;
}